

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

shared_ptr<cppnet::BufferBlock> __thiscall
cppnet::List<cppnet::BufferBlock>::PopFront(List<cppnet::BufferBlock> *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int *in_RSI;
  shared_ptr<cppnet::BufferBlock> sVar3;
  undefined1 local_19;
  List<cppnet::BufferBlock> *this_local;
  shared_ptr<cppnet::BufferBlock> *ret;
  
  this_local = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 2));
  if (bVar1) {
    local_19 = 0;
    std::shared_ptr<cppnet::BufferBlock>::shared_ptr
              ((shared_ptr<cppnet::BufferBlock> *)this,
               (shared_ptr<cppnet::BufferBlock> *)(in_RSI + 2));
    std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )(in_RSI + 2));
    ListSlot<cppnet::BufferBlock>::GetNext
              ((ListSlot<cppnet::BufferBlock> *)&stack0xffffffffffffffd0);
    std::shared_ptr<cppnet::BufferBlock>::operator=
              ((shared_ptr<cppnet::BufferBlock> *)(in_RSI + 2),
               (shared_ptr<cppnet::BufferBlock> *)&stack0xffffffffffffffd0);
    std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
              ((shared_ptr<cppnet::BufferBlock> *)&stack0xffffffffffffffd0);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 2));
    _Var2._M_pi = extraout_RDX_00;
    if (!bVar1) {
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 6));
      _Var2._M_pi = extraout_RDX_01;
    }
    *in_RSI = *in_RSI + -1;
  }
  else {
    std::shared_ptr<cppnet::BufferBlock>::shared_ptr
              ((shared_ptr<cppnet::BufferBlock> *)this,(nullptr_t)0x0);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppnet::BufferBlock>)
         sVar3.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> PopFront() {
        if (!_head) {
            return nullptr;
        }

        auto ret = _head;
        _head = _head->GetNext();
        if (!_head) {
            _tail.reset();
        }
        
        _size--;

        return ret;
    }